

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O2

EntryType * __thiscall
SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
::GetFreeEntry(SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
               *this)

{
  HeapAllocator *alloc;
  EntryType *pEVar1;
  undefined1 local_30 [8];
  TrackAllocData data;
  
  pEVar1 = this->free;
  if (pEVar1 != (EntryType *)0x0) {
    this->free = pEVar1->next;
    this->freecount = this->freecount - 1;
    return pEVar1;
  }
  local_30 = (undefined1  [8])&SimpleHashEntry<void*,Memory::Recycler::PinRecord>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_26dcd30;
  data.filename._0_4_ = 0x14a;
  alloc = Memory::HeapAllocator::TrackAllocInfo(this->allocator,(TrackAllocData *)local_30);
  pEVar1 = (EntryType *)new<Memory::HeapAllocator>(0x20,alloc,0x2f6726);
  (pEVar1->value).stackBackTraces = (StackBackTraceNode *)0x0;
  (pEVar1->value).refCount = 0;
  return pEVar1;
}

Assistant:

EntryType* GetFreeEntry()
    {
        EntryType* retFree = free;
        if (nullptr == retFree )
        {
            retFree = AllocatorNewStruct(TAllocator, allocator, EntryType);
        }
        else
        {
            free = retFree->next;
            freecount--;
        }
        return retFree;
    }